

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

int yaml_parser_fetch_more_tokens(yaml_parser_t *parser)

{
  yaml_token_t **head;
  yaml_token_t **tail;
  yaml_mark_t *pyVar1;
  size_t *psVar2;
  byte bVar3;
  byte bVar4;
  yaml_char_t yVar5;
  yaml_encoding_t yVar6;
  yaml_simple_key_t *pyVar7;
  yaml_mark_t start_mark_00;
  yaml_mark_t start_mark_01;
  yaml_mark_t start_mark_02;
  yaml_mark_t start_mark_03;
  bool bVar8;
  undefined4 uVar9;
  int iVar10;
  int iVar11;
  yaml_token_t *pyVar12;
  yaml_simple_key_t *pyVar13;
  byte *pbVar14;
  char *pcVar15;
  uint uVar16;
  size_t sVar18;
  long lVar19;
  ulong uVar20;
  yaml_token_type_t yVar21;
  yaml_token_t *pyVar22;
  yaml_char_t *ptr;
  byte bVar23;
  yaml_char_t *handle_value;
  yaml_mark_t start_mark;
  int major;
  byte *local_118;
  byte *pbStack_110;
  byte *local_108 [2];
  yaml_mark_t *local_f8;
  byte *local_f0;
  size_t local_e8;
  size_t sStack_e0;
  size_t local_d8;
  yaml_mark_t *local_d0;
  yaml_char_t *local_c8;
  yaml_token_t **local_c0;
  byte *local_b8;
  anon_struct_32_4_6186f7ca_for_tokens *local_b0;
  yaml_char_t *local_a8;
  int local_a0;
  int local_9c;
  yaml_token_t local_98;
  anon_struct_24_3_654a3493_for_simple_keys *local_48;
  yaml_simple_key_t **local_40;
  yaml_simple_key_t **local_38;
  uint uVar17;
  
  bVar23 = 0;
  head = &(parser->tokens).head;
  tail = &(parser->tokens).tail;
  pyVar1 = &parser->mark;
  local_f8 = &parser->context_mark;
  local_d0 = &parser->problem_mark;
  local_c0 = &(parser->tokens).end;
  local_b0 = &parser->tokens;
  local_38 = &(parser->simple_keys).top;
  local_40 = &(parser->simple_keys).end;
  local_48 = &parser->simple_keys;
LAB_0010e73d:
  bVar8 = true;
  if (*head != *tail) {
    iVar10 = yaml_parser_stale_simple_keys(parser);
    bVar8 = false;
    if (iVar10 != 0) {
      pyVar13 = (parser->simple_keys).start;
      pyVar7 = (parser->simple_keys).top;
      if (pyVar13 != pyVar7) {
        do {
          if ((pyVar13->possible != 0) && (pyVar13->token_number == parser->tokens_parsed)) {
            bVar8 = true;
            goto LAB_0010e796;
          }
          pyVar13 = pyVar13 + 1;
        } while (pyVar13 != pyVar7);
        bVar8 = false;
      }
    }
LAB_0010e796:
    if (iVar10 == 0) {
      return 0;
    }
  }
  if (!bVar8) {
    parser->token_available = 1;
    return 1;
  }
  if ((parser->unread == 0) && (iVar10 = yaml_parser_update_buffer(parser,1), iVar10 == 0)) {
LAB_0010ed4c:
    iVar10 = 0;
  }
  else {
    if (parser->stream_start_produced != 0) {
LAB_0010e7d8:
      if ((parser->unread != 0) || (iVar10 = yaml_parser_update_buffer(parser,1), iVar10 != 0)) {
        if (((parser->mark).column == 0) &&
           (((pbVar14 = (parser->buffer).pointer, *pbVar14 == 0xef && (pbVar14[1] == 0xbb)) &&
            (pbVar14[2] == 0xbf)))) {
          (parser->mark).index = (parser->mark).index + 1;
          (parser->mark).column = 1;
          parser->unread = parser->unread - 1;
          bVar3 = *pbVar14;
          lVar19 = 1;
          if ((((char)bVar3 < '\0') && (lVar19 = 2, (bVar3 & 0xe0) != 0xc0)) &&
             (lVar19 = 3, (bVar3 & 0xf0) != 0xe0)) {
            lVar19 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
          }
          (parser->buffer).pointer = pbVar14 + lVar19;
        }
        sVar18 = parser->unread;
        do {
          if ((sVar18 == 0) && (iVar10 = yaml_parser_update_buffer(parser,1), iVar10 == 0)) break;
          pbVar14 = (parser->buffer).pointer;
          bVar3 = *pbVar14;
          if (bVar3 != 0x20) {
            if (parser->flow_level == 0) {
              if ((bVar3 != 9) || (parser->simple_key_allowed != 0)) goto LAB_0010e94f;
            }
            else if (bVar3 != 9) goto LAB_0010e94f;
          }
          (parser->mark).index = (parser->mark).index + 1;
          psVar2 = &(parser->mark).column;
          *psVar2 = *psVar2 + 1;
          sVar18 = parser->unread - 1;
          parser->unread = sVar18;
          bVar3 = *pbVar14;
          lVar19 = 1;
          if ((((char)bVar3 < '\0') && (lVar19 = 2, (bVar3 & 0xe0) != 0xc0)) &&
             (lVar19 = 3, (bVar3 & 0xf0) != 0xe0)) {
            lVar19 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
          }
          (parser->buffer).pointer = pbVar14 + lVar19;
        } while( true );
      }
      goto LAB_0010ed4c;
    }
    parser->indent = -1;
    if (((parser->simple_keys).top == (parser->simple_keys).end) &&
       (iVar10 = yaml_stack_extend(&local_48->start,local_38,local_40), iVar10 == 0)) {
LAB_0010ed46:
      parser->error = YAML_MEMORY_ERROR;
      goto LAB_0010ed4c;
    }
    pyVar13 = (parser->simple_keys).top;
    (parser->simple_keys).top = pyVar13 + 1;
    (pyVar13->mark).index = 0;
    (pyVar13->mark).line = 0;
    pyVar13->possible = 0;
    pyVar13->required = 0;
    pyVar13->token_number = 0;
    (pyVar13->mark).column = 0;
    parser->simple_key_allowed = 1;
    parser->stream_start_produced = 1;
    local_98.data.scalar.length._0_4_ = 0;
    local_98.type = YAML_NO_TOKEN;
    local_98._4_4_ = 0;
    local_98.data.tag.handle = (byte *)0x0;
    sVar18 = (parser->mark).column;
    local_98.start_mark.index._4_4_ = (undefined4)sVar18;
    local_98.start_mark.line._0_4_ = (undefined4)(sVar18 >> 0x20);
    sVar18 = (parser->mark).line;
    local_98.data.scalar.length._4_4_ = (undefined4)pyVar1->index;
    local_98.data.scalar.style = (yaml_scalar_style_t)(pyVar1->index >> 0x20);
    local_98.data._20_4_ = (undefined4)sVar18;
    local_98.start_mark.index._0_4_ = (undefined4)(sVar18 >> 0x20);
    local_108[0] = (byte *)(parser->mark).column;
    local_118 = (byte *)pyVar1->index;
    pbStack_110 = (byte *)(parser->mark).line;
    yVar6 = parser->encoding;
    if (((parser->tokens).tail == (parser->tokens).end) &&
       (iVar10 = yaml_queue_extend(&local_b0->start,head,tail,local_c0), iVar10 == 0))
    goto LAB_0010ed46;
    pyVar12 = *tail;
    *tail = pyVar12 + 1;
    *(undefined8 *)pyVar12 = 1;
    (pyVar12->data).stream_start.encoding = yVar6;
    *(undefined8 *)((long)&(pyVar12->data).alias.value + 4) = local_98._0_8_;
    ((anon_struct_8_1_a8c68091_for_alias *)((long)&pyVar12->data + 0xc))->value =
         (yaml_char_t *)local_98.data.alias.value;
    *(ulong *)((long)&pyVar12->data + 0x14) =
         CONCAT44(local_98.data.scalar.length._4_4_,local_98.data.scalar.length._0_4_);
    *(ulong *)((long)&(pyVar12->start_mark).index + 4) =
         CONCAT44(local_98.data._20_4_,local_98.data.scalar.style);
    (pyVar12->start_mark).line =
         CONCAT44((undefined4)local_98.start_mark.index,local_98.data._20_4_);
    (pyVar12->start_mark).column =
         CONCAT44((undefined4)local_98.start_mark.line,local_98.start_mark.index._4_4_);
LAB_0010ed2c:
    (pyVar12->end_mark).index = (size_t)local_118;
    (pyVar12->end_mark).line = (size_t)pbStack_110;
    (pyVar12->end_mark).column = (size_t)local_108[0];
    iVar10 = 1;
  }
  goto LAB_0010ed4f;
LAB_0010e94f:
  if (bVar3 == 0x23) {
LAB_0010e958:
    pbVar14 = (parser->buffer).pointer;
    bVar3 = *pbVar14;
    if (bVar3 == 0xc2) {
      if (pbVar14[1] == 0x85) goto LAB_0010ea47;
LAB_0010e9ae:
      if (bVar3 == 0) goto LAB_0010ea47;
    }
    else {
      if (bVar3 == 0xe2) goto LAB_0010e9ae;
      if ((bVar3 < 0xe) && ((0x2401U >> (bVar3 & 0x1f) & 1) != 0)) goto LAB_0010ea47;
    }
    (parser->mark).index = (parser->mark).index + 1;
    psVar2 = &(parser->mark).column;
    *psVar2 = *psVar2 + 1;
    sVar18 = parser->unread - 1;
    parser->unread = sVar18;
    bVar3 = *pbVar14;
    lVar19 = 1;
    if (((char)bVar3 < '\0') &&
       ((lVar19 = 2, (bVar3 & 0xe0) != 0xc0 && (lVar19 = 3, (bVar3 & 0xf0) != 0xe0)))) {
      lVar19 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
    }
    (parser->buffer).pointer = pbVar14 + lVar19;
    if ((sVar18 == 0) && (iVar10 = yaml_parser_update_buffer(parser,1), iVar10 == 0))
    goto LAB_0010ed4c;
    goto LAB_0010e958;
  }
LAB_0010ea47:
  pbVar14 = (parser->buffer).pointer;
  bVar3 = *pbVar14;
  if (bVar3 < 0xc2) {
    if ((bVar3 == 10) || (bVar3 == 0xd)) {
LAB_0010eaa4:
      if ((parser->unread < 2) && (iVar10 = yaml_parser_update_buffer(parser,2), iVar10 == 0))
      goto LAB_0010ed4c;
      pbVar14 = (parser->buffer).pointer;
      bVar3 = *pbVar14;
      if (bVar3 < 0xc2) {
        if (bVar3 == 10) goto LAB_0010eb66;
        if (bVar3 != 0xd) goto LAB_0010ebd1;
        if (pbVar14[1] != 10) goto LAB_0010eb66;
        (parser->mark).index = (parser->mark).index + 2;
        (parser->mark).column = 0;
        psVar2 = &(parser->mark).line;
        *psVar2 = *psVar2 + 1;
        parser->unread = parser->unread - 2;
        lVar19 = 2;
      }
      else {
        if ((bVar3 != 0xc2) || (pbVar14[1] != 0x85)) goto LAB_0010ebd1;
LAB_0010eb66:
        (parser->mark).index = (parser->mark).index + 1;
        (parser->mark).column = 0;
        psVar2 = &(parser->mark).line;
        *psVar2 = *psVar2 + 1;
        parser->unread = parser->unread - 1;
        bVar3 = *pbVar14;
        lVar19 = 1;
        if ((((char)bVar3 < '\0') && (lVar19 = 2, (bVar3 & 0xe0) != 0xc0)) &&
           (lVar19 = 3, (bVar3 & 0xf0) != 0xe0)) {
          lVar19 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
        }
      }
      (parser->buffer).pointer = pbVar14 + lVar19;
LAB_0010ebd1:
      if (parser->flow_level == 0) {
        parser->simple_key_allowed = 1;
      }
      goto LAB_0010e7d8;
    }
  }
  else if (((bVar3 != 0xe2) && (bVar3 == 0xc2)) && (pbVar14[1] == 0x85)) goto LAB_0010eaa4;
  iVar11 = yaml_parser_stale_simple_keys(parser);
  iVar10 = 0;
  if (((iVar11 == 0) ||
      (iVar11 = yaml_parser_unroll_indent(parser,(parser->mark).column), iVar11 == 0)) ||
     ((parser->unread < 4 && (iVar11 = yaml_parser_update_buffer(parser,4), iVar11 == 0))))
  goto LAB_0010ed4f;
  pbVar14 = (parser->buffer).pointer;
  bVar3 = *pbVar14;
  if (bVar3 == 0) {
    if ((parser->mark).column != 0) {
      (parser->mark).column = 0;
      psVar2 = &(parser->mark).line;
      *psVar2 = *psVar2 + 1;
    }
    iVar11 = yaml_parser_unroll_indent(parser,-1);
    iVar10 = 0;
    if (iVar11 == 0) goto LAB_0010ed4f;
    pyVar13 = (parser->simple_keys).top;
    if ((pyVar13[-1].possible == 0) || (pyVar13[-1].required == 0)) {
      pyVar13[-1].possible = 0;
      parser->simple_key_allowed = 0;
      local_98.data.scalar.length._0_4_ = 0;
      local_98.data.scalar.length._4_4_ = 0;
      local_98.data.scalar.style = YAML_ANY_SCALAR_STYLE;
      local_98.type = YAML_NO_TOKEN;
      local_98._4_4_ = 0;
      local_98.data.tag.handle = (byte *)0x0;
      sVar18 = (parser->mark).column;
      local_98.start_mark.line._4_4_ = (undefined4)sVar18;
      local_98.start_mark.column._0_4_ = (undefined4)(sVar18 >> 0x20);
      sVar18 = (parser->mark).line;
      local_98.data._20_4_ = (undefined4)pyVar1->index;
      local_98.start_mark.index._0_4_ = (undefined4)(pyVar1->index >> 0x20);
      local_98.start_mark.index._4_4_ = (undefined4)sVar18;
      local_98.start_mark.line._0_4_ = (undefined4)(sVar18 >> 0x20);
      local_108[0] = (byte *)(parser->mark).column;
      local_118 = (byte *)pyVar1->index;
      pbStack_110 = (byte *)(parser->mark).line;
      if (((parser->tokens).tail != (parser->tokens).end) ||
         (iVar10 = yaml_queue_extend(&local_b0->start,head,tail,local_c0), iVar10 != 0)) {
        pyVar12 = *tail;
        *tail = pyVar12 + 1;
        pyVar12->type = YAML_STREAM_END_TOKEN;
        *(undefined8 *)&pyVar12->field_0x4 = local_98._0_8_;
        ((anon_struct_8_1_a8c68091_for_alias *)((long)&pyVar12->data + 4))->value =
             (yaml_char_t *)local_98.data.alias.value;
        *(ulong *)((long)&(pyVar12->data).scalar.length + 4) =
             CONCAT44(local_98.data.scalar.length._4_4_,local_98.data.scalar.length._0_4_);
        *(ulong *)((long)&pyVar12->data + 0x14) =
             CONCAT44(local_98.data._20_4_,local_98.data.scalar.style);
        *(ulong *)((long)&(pyVar12->start_mark).index + 4) =
             CONCAT44(local_98.start_mark.index._4_4_,(undefined4)local_98.start_mark.index);
        *(ulong *)((long)&(pyVar12->start_mark).line + 4) =
             CONCAT44(local_98.start_mark.line._4_4_,(undefined4)local_98.start_mark.line);
        *(undefined4 *)((long)&(pyVar12->start_mark).column + 4) =
             (undefined4)local_98.start_mark.column;
        goto LAB_0010ed2c;
      }
      parser->error = YAML_MEMORY_ERROR;
      iVar10 = 0;
      goto LAB_0010ed4f;
    }
LAB_0010ef32:
    local_108[0] = (byte *)pyVar13[-1].mark.column;
    local_118 = (byte *)pyVar13[-1].mark.index;
    pbStack_110 = (byte *)pyVar13[-1].mark.line;
    parser->error = YAML_SCANNER_ERROR;
    parser->context = "while scanning a simple key";
    local_f8->column = (size_t)local_108[0];
    local_f8->index = (size_t)local_118;
    local_f8->line = (size_t)pbStack_110;
    parser->problem = "could not find expected \':\'";
    local_d0->column = (parser->mark).column;
    sVar18 = (parser->mark).line;
    local_d0->index = pyVar1->index;
    local_d0->line = sVar18;
    iVar10 = 0;
    goto LAB_0010ed4f;
  }
  sVar18 = (parser->mark).column;
  if (bVar3 == 0x25 && sVar18 == 0) {
    iVar11 = yaml_parser_unroll_indent(parser,-1);
    iVar10 = 0;
    if (iVar11 == 0) goto LAB_0010ed4f;
    pyVar13 = (parser->simple_keys).top;
    if ((pyVar13[-1].possible == 0) || (pyVar13[-1].required == 0)) {
      pyVar13[-1].possible = 0;
      parser->simple_key_allowed = 0;
      local_e8 = pyVar1->index;
      sStack_e0 = (parser->mark).line;
      local_d8 = (parser->mark).column;
      (parser->mark).index = (parser->mark).index + 1;
      psVar2 = &(parser->mark).column;
      *psVar2 = *psVar2 + 1;
      parser->unread = parser->unread - 1;
      pbVar14 = (parser->buffer).pointer;
      bVar3 = *pbVar14;
      lVar19 = 1;
      if (((char)bVar3 < '\0') &&
         ((lVar19 = 2, (bVar3 & 0xe0) != 0xc0 && (lVar19 = 3, (bVar3 & 0xf0) != 0xe0)))) {
        lVar19 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
      }
      (parser->buffer).pointer = pbVar14 + lVar19;
      local_118 = (byte *)0x0;
      pbStack_110 = (byte *)0x0;
      local_108[0] = (byte *)0x0;
      local_118 = (byte *)yaml_malloc(0x10);
      if (local_118 == (byte *)0x0) goto LAB_0010f84a;
      pbStack_110 = local_118 + 0x10;
      local_118[0] = 0;
      local_118[1] = 0;
      local_118[2] = 0;
      local_118[3] = 0;
      local_118[4] = 0;
      local_118[5] = 0;
      local_118[6] = 0;
      local_118[7] = 0;
      local_118[8] = 0;
      local_118[9] = 0;
      local_118[10] = 0;
      local_118[0xb] = 0;
      local_118[0xc] = 0;
      local_118[0xd] = 0;
      local_118[0xe] = 0;
      local_118[0xf] = 0;
      sVar18 = parser->unread;
      local_108[0] = local_118;
      goto joined_r0x0010eed3;
    }
    goto LAB_0010ef32;
  }
  if (((bVar3 != 0x2d || sVar18 != 0) || (pbVar14[1] != 0x2d)) || (pbVar14[2] != 0x2d))
  goto LAB_0010f112;
  bVar4 = pbVar14[3];
  if (((ulong)bVar4 < 0x21) && ((0x100002601U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) {
LAB_0010efdc:
    yVar21 = YAML_DOCUMENT_START_TOKEN;
    goto LAB_0010f152;
  }
  if (bVar4 == 0xe2) {
    if ((pbVar14[4] == 0x80) && (pbVar14[5] == 0xa8)) goto LAB_0010efdc;
  }
  else if ((bVar4 == 0xc2) && (pbVar14[4] == 0x85)) goto LAB_0010efdc;
LAB_0010f112:
  if (((bVar3 != 0x2e || sVar18 != 0) || (pbVar14[1] != 0x2e)) || (pbVar14[2] != 0x2e))
  goto LAB_0010f19f;
  bVar4 = pbVar14[3];
  if (((ulong)bVar4 < 0x21) && ((0x100002601U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) {
LAB_0010f14a:
    yVar21 = YAML_DOCUMENT_END_TOKEN;
LAB_0010f152:
    iVar10 = yaml_parser_fetch_document_indicator(parser,yVar21);
    goto LAB_0010ed4f;
  }
  if (bVar4 == 0xe2) {
    if ((pbVar14[4] == 0x80) && (pbVar14[5] == 0xa8)) goto LAB_0010f14a;
  }
  else if ((bVar4 == 0xc2) && (pbVar14[4] == 0x85)) goto LAB_0010f14a;
LAB_0010f19f:
  uVar16 = (uint)bVar3;
  uVar17 = (uint)bVar3;
  if (0x39 < bVar3) {
    if (bVar3 < 0x5d) {
      if (uVar17 == 0x3e || bVar3 < 0x3e) {
        if (uVar16 == 0x3a) {
LAB_0010f49c:
          if (parser->flow_level != 0) {
LAB_0010f4bf:
            iVar10 = yaml_parser_fetch_value(parser);
            goto LAB_0010ed4f;
          }
          bVar4 = pbVar14[1];
          if (((ulong)bVar4 < 0x21) && ((0x100002601U >> ((ulong)bVar4 & 0x3f) & 1) != 0))
          goto LAB_0010f4bf;
          if (bVar4 == 0xe2) {
            if ((pbVar14[2] == 0x80) && (pbVar14[3] == 0xa8)) goto LAB_0010f4bf;
          }
          else if ((bVar4 == 0xc2) && (pbVar14[2] == 0x85)) goto LAB_0010f4bf;
          if (bVar3 < 0x3e) {
            switch(bVar3) {
            case 0x20:
              goto switchD_0010f1be_caseD_0;
            case 0x21:
switchD_0010f1be_caseD_1:
              iVar10 = yaml_parser_fetch_tag(parser);
              goto LAB_0010ed4f;
            case 0x22:
              goto switchD_0010f1be_caseD_2;
            case 0x23:
            case 0x24:
            case 0x25:
            case 0x28:
            case 0x29:
              goto switchD_0010f52a_caseD_23;
            case 0x26:
              goto switchD_0010f1be_caseD_6;
            case 0x27:
              goto switchD_0010f1be_caseD_7;
            case 0x2a:
              goto switchD_0010f1be_caseD_a;
            default:
              goto switchD_0010f52a_default;
            }
          }
          if (0xc1 < uVar16) goto LAB_0010f1ed;
          if (uVar16 == 0x3e) goto LAB_0010f21f;
          if (uVar16 == 0x7c) goto LAB_0010f562;
          goto switchD_0010f52a_caseD_23;
        }
        if (uVar16 == 0x3e) goto LAB_0010f21f;
      }
      else {
        if (uVar17 == 0x3f) {
LAB_0010f3ec:
          if (parser->flow_level != 0) {
LAB_0010f40f:
            iVar10 = yaml_parser_fetch_key(parser);
            goto LAB_0010ed4f;
          }
          bVar4 = pbVar14[1];
          if (((ulong)bVar4 < 0x21) && ((0x100002601U >> ((ulong)bVar4 & 0x3f) & 1) != 0))
          goto LAB_0010f40f;
          if (bVar4 == 0xe2) {
            if ((pbVar14[2] == 0x80) && (pbVar14[3] == 0xa8)) goto LAB_0010f40f;
          }
          else if ((bVar4 == 0xc2) && (pbVar14[2] == 0x85)) goto LAB_0010f40f;
          if (bVar3 < 0x3a) {
            switch(bVar3) {
            case 0x20:
              goto switchD_0010f1be_caseD_0;
            case 0x21:
              goto switchD_0010f1be_caseD_1;
            case 0x22:
              goto switchD_0010f1be_caseD_2;
            case 0x23:
            case 0x24:
            case 0x25:
            case 0x28:
            case 0x29:
              goto switchD_0010f52a_caseD_23;
            case 0x26:
              goto switchD_0010f1be_caseD_6;
            case 0x27:
              goto switchD_0010f1be_caseD_7;
            case 0x2a:
              goto switchD_0010f1be_caseD_a;
            default:
              goto switchD_0010f52a_default;
            }
          }
          if (0x7b < bVar3) goto LAB_0010f485;
          if (uVar16 == 0x3a) goto LAB_0010f49c;
LAB_0010f5af:
          if (bVar3 != 0x3e) goto switchD_0010f52a_caseD_23;
LAB_0010f21f:
          if (parser->flow_level == 0) {
            iVar10 = 0;
LAB_0010f594:
            iVar10 = yaml_parser_fetch_block_scalar(parser,iVar10);
            goto LAB_0010ed4f;
          }
          if (uVar17 < 0x28) {
            uVar20 = (ulong)uVar17;
            if ((0x100002600U >> (uVar20 & 0x3f) & 1) != 0) goto switchD_0010f1be_caseD_0;
            if (uVar20 == 0x22) goto switchD_0010f1be_caseD_2;
            if (uVar20 == 0x27) goto switchD_0010f1be_caseD_7;
          }
          goto LAB_0010f1ed;
        }
        if (uVar17 == 0x5b) {
          yVar21 = YAML_FLOW_SEQUENCE_START_TOKEN;
          goto LAB_0010f2a2;
        }
      }
      goto switchD_0010f1be_caseD_3;
    }
    if (bVar3 < 0x7c) {
      if (uVar16 == 0x5d) {
        yVar21 = YAML_FLOW_SEQUENCE_END_TOKEN;
LAB_0010f338:
        iVar10 = yaml_parser_fetch_flow_collection_end(parser,yVar21);
        goto LAB_0010ed4f;
      }
      if (uVar17 == 0x7b) {
        yVar21 = YAML_FLOW_MAPPING_START_TOKEN;
LAB_0010f2a2:
        iVar10 = yaml_parser_fetch_flow_collection_start(parser,yVar21);
        goto LAB_0010ed4f;
      }
      goto switchD_0010f1be_caseD_3;
    }
    if (uVar17 == 0x7c) {
LAB_0010f562:
      if (parser->flow_level == 0) {
        iVar10 = 1;
        goto LAB_0010f594;
      }
      if (bVar3 < 0x27) {
        if (bVar3 < 0x20) goto switchD_0010f52a_default;
        if (uVar17 != 0x20) {
          if (bVar3 != 0x22) goto switchD_0010f52a_caseD_23;
          goto switchD_0010f1be_caseD_2;
        }
        goto switchD_0010f1be_caseD_0;
      }
      if (uVar16 < 0xc2) {
        if (uVar16 != 0x27) goto LAB_0010f5af;
        goto switchD_0010f1be_caseD_7;
      }
    }
    else if (bVar3 == 0x7d) {
      yVar21 = YAML_FLOW_MAPPING_END_TOKEN;
      goto LAB_0010f338;
    }
LAB_0010f1ed:
    if ((uVar16 != 0xc2) || (pbVar14[1] != 0x85)) goto switchD_0010f1be_caseD_3;
LAB_0010f2ce:
    if (uVar16 != 0x2d) goto switchD_0010f1be_caseD_0;
    goto LAB_0010f2d7;
  }
  switch(bVar3 - 0x20) {
  case 0:
    break;
  case 1:
    goto switchD_0010f1be_caseD_1;
  case 2:
switchD_0010f1be_caseD_2:
    iVar10 = 0;
LAB_0010f5d3:
    iVar10 = yaml_parser_fetch_flow_scalar(parser,iVar10);
    goto LAB_0010ed4f;
  case 3:
  case 4:
  case 5:
  case 8:
  case 9:
  case 0xb:
switchD_0010f1be_caseD_3:
    if (((uVar16 == 0xe2) && (pbVar14[1] == 0x80)) && (pbVar14[2] == 0xa8)) goto LAB_0010f2ce;
    goto switchD_0010f52a_caseD_23;
  case 6:
switchD_0010f1be_caseD_6:
    yVar21 = YAML_ANCHOR_TOKEN;
LAB_0010f53e:
    iVar10 = yaml_parser_fetch_anchor(parser,yVar21);
    goto LAB_0010ed4f;
  case 7:
switchD_0010f1be_caseD_7:
    iVar10 = 1;
    goto LAB_0010f5d3;
  case 10:
switchD_0010f1be_caseD_a:
    yVar21 = YAML_ALIAS_TOKEN;
    goto LAB_0010f53e;
  case 0xc:
    iVar10 = yaml_parser_fetch_flow_entry(parser);
    goto LAB_0010ed4f;
  case 0xd:
    bVar4 = pbVar14[1];
    if (((ulong)bVar4 < 0x21) && ((0x100002601U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) {
LAB_0010f30c:
      iVar10 = yaml_parser_fetch_block_entry(parser);
      goto LAB_0010ed4f;
    }
    if (bVar4 == 0xe2) {
      if ((pbVar14[2] == 0x80) && (pbVar14[3] == 0xa8)) goto LAB_0010f30c;
    }
    else if ((bVar4 == 0xc2) && (pbVar14[2] == 0x85)) goto LAB_0010f30c;
    if (bVar3 < 0x3a) {
      switch(bVar3 - 0x20) {
      case 0:
        break;
      case 1:
        goto switchD_0010f1be_caseD_1;
      case 2:
        goto switchD_0010f1be_caseD_2;
      case 3:
      case 4:
      case 5:
      case 8:
      case 9:
        goto switchD_0010f52a_caseD_23;
      case 6:
        goto switchD_0010f1be_caseD_6;
      case 7:
        goto switchD_0010f1be_caseD_7;
      case 10:
        goto switchD_0010f1be_caseD_a;
      default:
switchD_0010f52a_default:
        if ((1 < bVar3 - 9) && (uVar16 != 0xd)) goto switchD_0010f52a_caseD_23;
      }
      break;
    }
    if (uVar17 != 0x7b && 0x7a < bVar3) {
LAB_0010f485:
      if (bVar3 == 0x7c) goto LAB_0010f562;
      goto LAB_0010f1ed;
    }
    if (uVar17 == 0x3a) goto LAB_0010f49c;
    if (uVar17 == 0x3e) goto LAB_0010f21f;
    if (bVar3 == 0x3f) goto LAB_0010f3ec;
switchD_0010f52a_caseD_23:
    if (uVar16 < 0x3b) {
      if ((0x40014ee00000001U >> ((ulong)uVar16 & 0x3f) & 1) == 0) {
        if ((ulong)uVar16 != 0x2d) goto LAB_0010f5fe;
LAB_0010f2d7:
        if ((pbVar14[1] != 0x20) && (pbVar14[1] != 9)) goto LAB_0010f6e8;
      }
    }
    else {
LAB_0010f5fe:
      if ((0x3f < bVar3 - 0x3e) ||
         ((0xe0000004a0000007U >> ((ulong)(bVar3 - 0x3e) & 0x3f) & 1) == 0)) goto LAB_0010f6e8;
    }
    break;
  default:
    if ((1 < bVar3 - 9) && (bVar3 != 0xd)) goto switchD_0010f1be_caseD_3;
  }
switchD_0010f1be_caseD_0:
  if ((parser->flow_level == 0) && ((uVar17 == 0x3f || (uVar17 == 0x3a)))) {
    bVar3 = pbVar14[1];
    if ((0x20 < (ulong)bVar3) || ((0x100002601U >> ((ulong)bVar3 & 0x3f) & 1) == 0)) {
      if (bVar3 == 0xe2) {
        if ((pbVar14[2] != 0x80) || (pbVar14[3] != 0xa8)) goto LAB_0010f6e8;
      }
      else if ((bVar3 != 0xc2) || (pbVar14[2] != 0x85)) {
LAB_0010f6e8:
        iVar10 = yaml_parser_fetch_plain_scalar(parser);
        goto LAB_0010ed4f;
      }
    }
  }
  parser->error = YAML_SCANNER_ERROR;
  parser->context = "while scanning for the next token";
  local_f8->column = (parser->mark).column;
  sVar18 = (parser->mark).line;
  local_f8->index = pyVar1->index;
  local_f8->line = sVar18;
  parser->problem = "found character that cannot start any token";
  local_d0->column = (parser->mark).column;
  sVar18 = (parser->mark).line;
  local_d0->index = pyVar1->index;
  local_d0->line = sVar18;
  iVar10 = 0;
  goto LAB_0010ed4f;
joined_r0x0010eed3:
  if ((sVar18 == 0) && (iVar11 = yaml_parser_update_buffer(parser,1), iVar11 == 0))
  goto LAB_0010f850;
  pbVar14 = (parser->buffer).pointer;
  bVar3 = *pbVar14;
  if ((9 < (byte)(bVar3 - 0x30)) &&
     (((0x19 < (byte)((bVar3 & 0xdf) + 0xbf) && (bVar3 != 0x5f)) && (bVar3 != 0x2d)))) {
    if (local_118 == local_108[0]) {
      parser->error = YAML_SCANNER_ERROR;
      parser->context = "while scanning a directive";
      local_f8->column = local_d8;
      local_f8->index = local_e8;
      local_f8->line = sStack_e0;
      pcVar15 = "could not find expected directive name";
    }
    else {
      uVar16 = (uint)bVar3;
      if ((bVar3 < 0x21) && ((0x100002601U >> ((ulong)uVar16 & 0x3f) & 1) != 0)) {
LAB_0010f966:
        bVar8 = false;
        goto LAB_0010f86f;
      }
      if (uVar16 == 0xe2) {
LAB_0010f9f3:
        if (uVar16 == 0) goto LAB_0010f966;
      }
      else if (bVar3 == 0xc2) {
        if (pbVar14[1] == 0x85) goto LAB_0010f966;
        if (uVar16 == 0xe2) goto LAB_0010f9f3;
      }
      parser->error = YAML_SCANNER_ERROR;
      parser->context = "while scanning a directive";
      local_f8->column = local_d8;
      local_f8->index = local_e8;
      local_f8->line = sStack_e0;
      pcVar15 = "found unexpected non-alphabetical character";
    }
    parser->problem = pcVar15;
    local_d0->column = (parser->mark).column;
    sVar18 = (parser->mark).line;
    local_d0->index = pyVar1->index;
    local_d0->line = sVar18;
    goto LAB_0010f850;
  }
  if ((pbStack_110 <= local_108[0] + 5) &&
     (iVar11 = yaml_string_extend(&local_118,local_108,&pbStack_110), iVar11 == 0))
  goto LAB_0010f84a;
  pbVar14 = (parser->buffer).pointer;
  bVar3 = *pbVar14;
  if ((char)bVar3 < '\0') {
    if ((bVar3 & 0xe0) == 0xc0) {
LAB_0010f7e9:
      (parser->buffer).pointer = pbVar14 + 1;
      *local_108[0] = *pbVar14;
      pbVar14 = (parser->buffer).pointer;
      local_108[0] = local_108[0] + 1;
      goto LAB_0010f80d;
    }
    if ((bVar3 & 0xf0) == 0xe0) {
LAB_0010f7c5:
      (parser->buffer).pointer = pbVar14 + 1;
      *local_108[0] = *pbVar14;
      pbVar14 = (parser->buffer).pointer;
      local_108[0] = local_108[0] + 1;
      goto LAB_0010f7e9;
    }
    if ((bVar3 & 0xf8) == 0xf0) {
      (parser->buffer).pointer = pbVar14 + 1;
      *local_108[0] = *pbVar14;
      pbVar14 = (parser->buffer).pointer;
      local_108[0] = local_108[0] + 1;
      goto LAB_0010f7c5;
    }
  }
  else {
LAB_0010f80d:
    (parser->buffer).pointer = pbVar14 + 1;
    *local_108[0] = *pbVar14;
    local_108[0] = local_108[0] + 1;
  }
  (parser->mark).index = (parser->mark).index + 1;
  psVar2 = &(parser->mark).column;
  *psVar2 = *psVar2 + 1;
  psVar2 = &parser->unread;
  *psVar2 = *psVar2 - 1;
  sVar18 = *psVar2;
  goto joined_r0x0010eed3;
LAB_0010f84a:
  parser->error = YAML_MEMORY_ERROR;
LAB_0010f850:
  yaml_free(local_118);
  local_118 = (byte *)0x0;
  pbStack_110 = (byte *)0x0;
  local_108[0] = (byte *)0x0;
  bVar8 = true;
LAB_0010f86f:
  local_b8 = local_118;
  if (bVar8) {
LAB_0010f87b:
    local_f0 = (byte *)0x0;
    ptr = (yaml_char_t *)0x0;
  }
  else {
    iVar11 = strcmp((char *)local_118,"YAML");
    if (iVar11 == 0) {
      sVar18 = parser->unread;
      while( true ) {
        if ((sVar18 == 0) && (iVar11 = yaml_parser_update_buffer(parser,1), iVar11 == 0))
        goto LAB_0010f87b;
        pbVar14 = (parser->buffer).pointer;
        if ((*pbVar14 != 0x20) && (*pbVar14 != 9)) break;
        (parser->mark).index = (parser->mark).index + 1;
        psVar2 = &(parser->mark).column;
        *psVar2 = *psVar2 + 1;
        sVar18 = parser->unread - 1;
        parser->unread = sVar18;
        bVar3 = *pbVar14;
        lVar19 = 1;
        if ((((char)bVar3 < '\0') && (lVar19 = 2, (bVar3 & 0xe0) != 0xc0)) &&
           (lVar19 = 3, (bVar3 & 0xf0) != 0xe0)) {
          lVar19 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
        }
        (parser->buffer).pointer = pbVar14 + lVar19;
      }
      start_mark_02.line = sStack_e0;
      start_mark_02.index = local_e8;
      start_mark_02.column = local_d8;
      iVar11 = yaml_parser_scan_version_directive_number(parser,start_mark_02,&local_9c);
      if (iVar11 != 0) {
        pbVar14 = (parser->buffer).pointer;
        if (*pbVar14 != 0x2e) {
          parser->error = YAML_SCANNER_ERROR;
          parser->context = "while scanning a %YAML directive";
          local_f8->column = local_d8;
          local_f8->index = local_e8;
          local_f8->line = sStack_e0;
          pcVar15 = "did not find expected digit or \'.\' character";
          goto LAB_0010f8e9;
        }
        (parser->mark).index = (parser->mark).index + 1;
        psVar2 = &(parser->mark).column;
        *psVar2 = *psVar2 + 1;
        parser->unread = parser->unread - 1;
        bVar3 = *pbVar14;
        lVar19 = 1;
        if ((((char)bVar3 < '\0') && (lVar19 = 2, (bVar3 & 0xe0) != 0xc0)) &&
           (lVar19 = 3, (bVar3 & 0xf0) != 0xe0)) {
          lVar19 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
        }
        (parser->buffer).pointer = pbVar14 + lVar19;
        start_mark_03.line = sStack_e0;
        start_mark_03.index = local_e8;
        start_mark_03.column = local_d8;
        iVar11 = yaml_parser_scan_version_directive_number(parser,start_mark_03,&local_a0);
        if (iVar11 != 0) {
          local_98.data.scalar.length._0_4_ = 0;
          local_98.data.scalar.length._4_4_ = 0;
          local_98.type = YAML_VERSION_DIRECTIVE_TOKEN;
          local_98._4_4_ = 0;
          local_98.start_mark.column._0_4_ = (undefined4)local_d8;
          local_98.start_mark.column._4_4_ = (undefined4)(local_d8 >> 0x20);
          local_98.start_mark.index._0_4_ = (undefined4)local_e8;
          local_98.start_mark.index._4_4_ = (undefined4)(local_e8 >> 0x20);
          local_98.start_mark.line._0_4_ = (undefined4)sStack_e0;
          local_98.start_mark.line._4_4_ = (undefined4)(sStack_e0 >> 0x20);
          local_98.end_mark.column = (parser->mark).column;
          local_98.end_mark.index = pyVar1->index;
          local_98.end_mark.line = (parser->mark).line;
          local_98.data.version_directive.minor = local_a0;
          local_98.data.stream_start.encoding = (anon_struct_4_1_4deb52d1_for_stream_start)local_9c;
          local_f0 = (byte *)0x0;
          local_c8 = (yaml_char_t *)0x0;
          goto LAB_0010ffde;
        }
      }
      goto LAB_0010f87b;
    }
    iVar11 = strcmp((char *)local_b8,"TAG");
    if (iVar11 == 0) {
      local_118 = (byte *)0x0;
      local_a8 = (yaml_char_t *)0x0;
      sVar18 = parser->unread;
      while( true ) {
        if ((sVar18 == 0) && (iVar11 = yaml_parser_update_buffer(parser,1), iVar11 == 0))
        goto LAB_0010fcbe;
        pbVar14 = (parser->buffer).pointer;
        if ((*pbVar14 != 0x20) && (*pbVar14 != 9)) break;
        (parser->mark).index = (parser->mark).index + 1;
        psVar2 = &(parser->mark).column;
        *psVar2 = *psVar2 + 1;
        sVar18 = parser->unread - 1;
        parser->unread = sVar18;
        bVar3 = *pbVar14;
        lVar19 = 1;
        if ((((char)bVar3 < '\0') && (lVar19 = 2, (bVar3 & 0xe0) != 0xc0)) &&
           (lVar19 = 3, (bVar3 & 0xf0) != 0xe0)) {
          lVar19 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
        }
        (parser->buffer).pointer = pbVar14 + lVar19;
      }
      start_mark_00.line = sStack_e0;
      start_mark_00.index = local_e8;
      start_mark_00.column = local_d8;
      iVar11 = yaml_parser_scan_tag_handle(parser,1,start_mark_00,&local_118);
      if ((iVar11 != 0) &&
         ((parser->unread != 0 || (iVar11 = yaml_parser_update_buffer(parser,1), iVar11 != 0)))) {
        yVar5 = *(parser->buffer).pointer;
        if ((yVar5 == ' ') || (yVar5 == '\t')) {
          do {
            pbVar14 = (parser->buffer).pointer;
            if ((*pbVar14 != 0x20) && (*pbVar14 != 9)) {
              start_mark_01.line = sStack_e0;
              start_mark_01.index = local_e8;
              start_mark_01.column = local_d8;
              iVar11 = yaml_parser_scan_tag_uri(parser,1,(yaml_char_t *)0x0,start_mark_01,&local_a8)
              ;
              if ((iVar11 != 0) &&
                 ((parser->unread != 0 ||
                  (iVar11 = yaml_parser_update_buffer(parser,1), iVar11 != 0)))) {
                pbVar14 = (parser->buffer).pointer;
                bVar3 = *pbVar14;
                if ((((ulong)bVar3 < 0x21) && ((0x100002601U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) ||
                   (((bVar3 != 0xe2 && (bVar3 == 0xc2)) && (pbVar14[1] == 0x85)))) {
                  bVar8 = false;
                  local_f0 = local_118;
                  ptr = local_a8;
                  goto LAB_0010fcdb;
                }
                parser->error = YAML_SCANNER_ERROR;
                parser->context = "while scanning a %TAG directive";
                local_f8->column = local_d8;
                local_f8->index = local_e8;
                local_f8->line = sStack_e0;
                pcVar15 = "did not find expected whitespace or line break";
                goto LAB_0010fca6;
              }
              break;
            }
            (parser->mark).index = (parser->mark).index + 1;
            psVar2 = &(parser->mark).column;
            *psVar2 = *psVar2 + 1;
            sVar18 = parser->unread - 1;
            parser->unread = sVar18;
            bVar3 = *pbVar14;
            lVar19 = 1;
            if ((((char)bVar3 < '\0') && (lVar19 = 2, (bVar3 & 0xe0) != 0xc0)) &&
               (lVar19 = 3, (bVar3 & 0xf0) != 0xe0)) {
              lVar19 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
            }
            (parser->buffer).pointer = pbVar14 + lVar19;
          } while ((sVar18 != 0) || (iVar11 = yaml_parser_update_buffer(parser,1), iVar11 != 0));
        }
        else {
          parser->error = YAML_SCANNER_ERROR;
          parser->context = "while scanning a %TAG directive";
          local_f8->column = local_d8;
          local_f8->index = local_e8;
          local_f8->line = sStack_e0;
          pcVar15 = "did not find expected whitespace";
LAB_0010fca6:
          parser->problem = pcVar15;
          local_d0->column = (parser->mark).column;
          sVar18 = (parser->mark).line;
          local_d0->index = pyVar1->index;
          local_d0->line = sVar18;
        }
      }
LAB_0010fcbe:
      yaml_free(local_118);
      yaml_free(local_a8);
      bVar8 = true;
      local_f0 = (byte *)0x0;
      ptr = (yaml_char_t *)0x0;
LAB_0010fcdb:
      if (!bVar8) {
        local_98.type = YAML_TAG_DIRECTIVE_TOKEN;
        local_98._4_4_ = 0;
        local_98.start_mark.column._0_4_ = (undefined4)local_d8;
        local_98.start_mark.column._4_4_ = (undefined4)(local_d8 >> 0x20);
        local_98.start_mark.index._0_4_ = (undefined4)local_e8;
        local_98.start_mark.index._4_4_ = (undefined4)(local_e8 >> 0x20);
        local_98.start_mark.line._0_4_ = (undefined4)sStack_e0;
        local_98.start_mark.line._4_4_ = (undefined4)(sStack_e0 >> 0x20);
        local_98.end_mark.column = (parser->mark).column;
        local_98.end_mark.index = pyVar1->index;
        local_98.end_mark.line = (parser->mark).line;
        local_98.data.scalar.length._0_4_ = SUB84(ptr,0);
        local_98.data.scalar.length._4_4_ = (undefined4)((ulong)ptr >> 0x20);
        local_c8 = ptr;
        local_98.data.tag.handle = local_f0;
LAB_0010ffde:
        local_98.data._20_4_ = 0;
        local_98.data.scalar.style = YAML_ANY_SCALAR_STYLE;
        sVar18 = parser->unread;
        while( true ) {
          if ((sVar18 == 0) &&
             (iVar11 = yaml_parser_update_buffer(parser,1), ptr = local_c8, iVar11 == 0))
          goto LAB_0010f90c;
          pbVar14 = (parser->buffer).pointer;
          bVar3 = *pbVar14;
          if ((bVar3 != 9) && (bVar3 != 0x20)) break;
          (parser->mark).index = (parser->mark).index + 1;
          psVar2 = &(parser->mark).column;
          *psVar2 = *psVar2 + 1;
          sVar18 = parser->unread - 1;
          parser->unread = sVar18;
          bVar3 = *pbVar14;
          lVar19 = 1;
          if (((char)bVar3 < '\0') &&
             ((lVar19 = 2, (bVar3 & 0xe0) != 0xc0 && (lVar19 = 3, (bVar3 & 0xf0) != 0xe0)))) {
            lVar19 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
          }
          (parser->buffer).pointer = pbVar14 + lVar19;
        }
        if (bVar3 != 0x23) {
LAB_001101b9:
          pbVar14 = (parser->buffer).pointer;
          bVar3 = *pbVar14;
          if (bVar3 < 0xd) {
            if (bVar3 != 0) {
              if (bVar3 != 10) {
LAB_00110303:
                parser->error = YAML_SCANNER_ERROR;
                parser->context = "while scanning a directive";
                local_f8->column = local_d8;
                local_f8->index = local_e8;
                local_f8->line = sStack_e0;
                parser->problem = "did not find expected comment or line break";
                ptr = local_c8;
                goto LAB_0010f8f8;
              }
              goto LAB_00110241;
            }
          }
          else {
            if (bVar3 != 0xd) {
              if (((bVar3 == 0xe2) || (bVar3 != 0xc2)) || (pbVar14[1] != 0x85)) goto LAB_00110303;
              if (pbVar14[1] != 0x85) goto LAB_001103fe;
            }
LAB_00110241:
            if ((parser->unread < 2) &&
               (iVar11 = yaml_parser_update_buffer(parser,2), ptr = local_c8, iVar11 == 0))
            goto LAB_0010f90c;
            pbVar14 = (parser->buffer).pointer;
            bVar3 = *pbVar14;
            if (bVar3 < 0xc2) {
              if (bVar3 == 10) goto LAB_00110393;
              if (bVar3 != 0xd) goto LAB_001103fe;
              if (pbVar14[1] != 10) goto LAB_00110393;
              (parser->mark).index = (parser->mark).index + 2;
              (parser->mark).column = 0;
              psVar2 = &(parser->mark).line;
              *psVar2 = *psVar2 + 1;
              parser->unread = parser->unread - 2;
              lVar19 = 2;
            }
            else {
              if ((bVar3 != 0xc2) || (pbVar14[1] != 0x85)) goto LAB_001103fe;
LAB_00110393:
              (parser->mark).index = (parser->mark).index + 1;
              (parser->mark).column = 0;
              psVar2 = &(parser->mark).line;
              *psVar2 = *psVar2 + 1;
              parser->unread = parser->unread - 1;
              bVar3 = *pbVar14;
              lVar19 = 1;
              if ((((char)bVar3 < '\0') && (lVar19 = 2, (bVar3 & 0xe0) != 0xc0)) &&
                 (lVar19 = 3, (bVar3 & 0xf0) != 0xe0)) {
                lVar19 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
              }
            }
            (parser->buffer).pointer = pbVar14 + lVar19;
          }
LAB_001103fe:
          yaml_free(local_b8);
          if ((*tail == *local_c0) &&
             (iVar11 = yaml_queue_extend(&local_b0->start,head,tail,local_c0), iVar11 == 0)) {
            parser->error = YAML_MEMORY_ERROR;
            yaml_token_delete(&local_98);
          }
          else {
            pyVar12 = *tail;
            *tail = pyVar12 + 1;
            pyVar22 = &local_98;
            for (lVar19 = 10; lVar19 != 0; lVar19 = lVar19 + -1) {
              uVar9 = *(undefined4 *)&pyVar22->field_0x4;
              pyVar12->type = pyVar22->type;
              *(undefined4 *)&pyVar12->field_0x4 = uVar9;
              pyVar22 = (yaml_token_t *)((long)pyVar22 + ((ulong)bVar23 * -2 + 1) * 8);
              pyVar12 = (yaml_token_t *)((long)pyVar12 + (ulong)bVar23 * -0x10 + 8);
            }
            iVar10 = 1;
          }
          goto LAB_0010ed4f;
        }
        do {
          pbVar14 = (parser->buffer).pointer;
          bVar3 = *pbVar14;
          if (bVar3 == 0xc2) {
            if (pbVar14[1] == 0x85) goto LAB_001101b9;
LAB_0011011e:
            if (bVar3 == 0) goto LAB_001101b9;
          }
          else {
            if (bVar3 == 0xe2) goto LAB_0011011e;
            if ((bVar3 < 0xe) && ((0x2401U >> (bVar3 & 0x1f) & 1) != 0)) goto LAB_001101b9;
          }
          (parser->mark).index = (parser->mark).index + 1;
          psVar2 = &(parser->mark).column;
          *psVar2 = *psVar2 + 1;
          sVar18 = parser->unread - 1;
          parser->unread = sVar18;
          bVar3 = *pbVar14;
          lVar19 = 1;
          if ((((char)bVar3 < '\0') && (lVar19 = 2, (bVar3 & 0xe0) != 0xc0)) &&
             (lVar19 = 3, (bVar3 & 0xf0) != 0xe0)) {
            lVar19 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
          }
          (parser->buffer).pointer = pbVar14 + lVar19;
        } while ((sVar18 != 0) ||
                (iVar11 = yaml_parser_update_buffer(parser,1), ptr = local_c8, iVar11 != 0));
      }
    }
    else {
      parser->error = YAML_SCANNER_ERROR;
      parser->context = "while scanning a directive";
      local_f8->column = local_d8;
      local_f8->index = local_e8;
      local_f8->line = sStack_e0;
      pcVar15 = "found unknown directive name";
LAB_0010f8e9:
      parser->problem = pcVar15;
      local_f0 = (byte *)0x0;
      ptr = (yaml_char_t *)0x0;
LAB_0010f8f8:
      local_d0->column = (parser->mark).column;
      sVar18 = (parser->mark).line;
      local_d0->index = pyVar1->index;
      local_d0->line = sVar18;
    }
  }
LAB_0010f90c:
  yaml_free(ptr);
  yaml_free(local_f0);
  yaml_free(local_b8);
LAB_0010ed4f:
  if (iVar10 == 0) {
    return 0;
  }
  goto LAB_0010e73d;
}

Assistant:

YAML_DECLARE(int)
yaml_parser_fetch_more_tokens(yaml_parser_t *parser)
{
    int need_more_tokens;

    /* While we need more tokens to fetch, do it. */

    while (1)
    {
        /*
         * Check if we really need to fetch more tokens.
         */

        need_more_tokens = 0;

        if (parser->tokens.head == parser->tokens.tail)
        {
            /* Queue is empty. */

            need_more_tokens = 1;
        }
        else
        {
            yaml_simple_key_t *simple_key;

            /* Check if any potential simple key may occupy the head position. */

            if (!yaml_parser_stale_simple_keys(parser))
                return 0;

            for (simple_key = parser->simple_keys.start;
                    simple_key != parser->simple_keys.top; simple_key++) {
                if (simple_key->possible
                        && simple_key->token_number == parser->tokens_parsed) {
                    need_more_tokens = 1;
                    break;
                }
            }
        }

        /* We are finished. */

        if (!need_more_tokens)
            break;

        /* Fetch the next token. */

        if (!yaml_parser_fetch_next_token(parser))
            return 0;
    }

    parser->token_available = 1;

    return 1;
}